

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O2

void __thiscall
dxil_spv::SPIRVModule::Impl::emit_leaf_function_body
          (Impl *this,Function *func,CFGStructurizer *structurizer)

{
  CFGNode *node;
  Block *block;
  
  this->active_function = func;
  CFGStructurizer::traverse(structurizer,&this->super_BlockEmissionInterface);
  (this->builder).buildPoint =
       *(this->active_function->blocks).
        super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
        super__Vector_impl_data._M_start;
  node = CFGStructurizer::get_entry_block(structurizer);
  block = get_spv_block(node);
  spv::Builder::createBranch(&this->builder,block);
  spv::Builder::leaveFunction(&this->builder);
  this->active_function = (Function *)0x0;
  return;
}

Assistant:

void SPIRVModule::Impl::emit_leaf_function_body(spv::Function *func, CFGStructurizer &structurizer)
{
	active_function = func;
	{
		structurizer.traverse(*this);
		builder.setBuildPoint(active_function->getEntryBlock());
		builder.createBranch(get_spv_block(structurizer.get_entry_block()));
		builder.leaveFunction();
	}
	active_function = nullptr;
}